

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseSizeof(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *end;
  SynBase *local_28;
  SynBase *value;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_sizeof);
  if (bVar1) {
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_oparen,"ERROR: sizeof must be followed by \'(\'");
    local_28 = ParseAssignment(ctx);
    if (local_28 == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_11716f::Report
                (ctx,pLVar2,"ERROR: expression or type not found after sizeof(");
      local_28 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      end = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_28,pLVar2,end);
    }
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in sizeof");
    ctx_local = (ParseContext *)ParseContext::get<SynSizeof>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynSizeof::SynSizeof((SynSizeof *)ctx_local,begin,pLVar2,local_28);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseSizeof(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_sizeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: sizeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression or type not found after sizeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in sizeof");

		return new (ctx.get<SynSizeof>()) SynSizeof(start, ctx.Previous(), value);
	}

	return NULL;
}